

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5ExprNode *
sqlite3Fts5ParseImplicitAnd(Fts5Parse *pParse,Fts5ExprNode *pLeft,Fts5ExprNode *pRight)

{
  Fts5ExprPhrase **ap;
  Fts5ExprNode *pPrev;
  Fts5ExprNode *pRet;
  Fts5ExprNode *pRight_local;
  Fts5ExprNode *pLeft_local;
  Fts5Parse *pParse_local;
  
  pPrev = (Fts5ExprNode *)0x0;
  if (pParse->rc == 0) {
    ap = (Fts5ExprPhrase **)pLeft;
    if (pLeft->eType == 2) {
      ap = (Fts5ExprPhrase **)pLeft->apChild[pLeft->nChild + -1];
    }
    if (pRight->eType == 0) {
      sqlite3Fts5ParseNodeFree(pRight);
      pParse->nPhrase = pParse->nPhrase + -1;
      pPrev = pLeft;
    }
    else if (*(int *)ap == 0) {
      pPrev = pRight;
      if ((Fts5ExprNode *)ap != pLeft) {
        pLeft->apChild[pLeft->nChild + -1] = pRight;
        pPrev = pLeft;
      }
      memmove(pParse->apPhrase + ((pParse->nPhrase + -1) - pRight->pNear->nPhrase),
              pParse->apPhrase + ((pParse->nPhrase + -1) - pRight->pNear->nPhrase) + 1,
              (long)pRight->pNear->nPhrase << 3);
      pParse->nPhrase = pParse->nPhrase + -1;
      sqlite3Fts5ParseNodeFree((Fts5ExprNode *)ap);
    }
    else {
      pPrev = sqlite3Fts5ParseNode(pParse,2,pLeft,pRight,(Fts5ExprNearset *)0x0);
    }
  }
  else {
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
  }
  return pPrev;
}

Assistant:

static Fts5ExprNode *sqlite3Fts5ParseImplicitAnd(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprNode *pLeft,            /* Left hand child expression */
  Fts5ExprNode *pRight            /* Right hand child expression */
){
  Fts5ExprNode *pRet = 0;
  Fts5ExprNode *pPrev;

  if( pParse->rc ){
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
  }else{

    assert( pLeft->eType==FTS5_STRING 
        || pLeft->eType==FTS5_TERM
        || pLeft->eType==FTS5_EOF
        || pLeft->eType==FTS5_AND
    );
    assert( pRight->eType==FTS5_STRING 
        || pRight->eType==FTS5_TERM 
        || pRight->eType==FTS5_EOF 
    );

    if( pLeft->eType==FTS5_AND ){
      pPrev = pLeft->apChild[pLeft->nChild-1];
    }else{
      pPrev = pLeft;
    }
    assert( pPrev->eType==FTS5_STRING 
        || pPrev->eType==FTS5_TERM 
        || pPrev->eType==FTS5_EOF 
        );

    if( pRight->eType==FTS5_EOF ){
      assert( pParse->apPhrase[pParse->nPhrase-1]==pRight->pNear->apPhrase[0] );
      sqlite3Fts5ParseNodeFree(pRight);
      pRet = pLeft;
      pParse->nPhrase--;
    }
    else if( pPrev->eType==FTS5_EOF ){
      Fts5ExprPhrase **ap;

      if( pPrev==pLeft ){
        pRet = pRight;
      }else{
        pLeft->apChild[pLeft->nChild-1] = pRight;
        pRet = pLeft;
      }

      ap = &pParse->apPhrase[pParse->nPhrase-1-pRight->pNear->nPhrase];
      assert( ap[0]==pPrev->pNear->apPhrase[0] );
      memmove(ap, &ap[1], sizeof(Fts5ExprPhrase*)*pRight->pNear->nPhrase);
      pParse->nPhrase--;

      sqlite3Fts5ParseNodeFree(pPrev);
    }
    else{
      pRet = sqlite3Fts5ParseNode(pParse, FTS5_AND, pLeft, pRight, 0);
    }
  }

  return pRet;
}